

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O2

void Acb_ObjRemoveBufInv(Acb_Ntk_t *p,int iObj)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  word wVar5;
  int *piVar6;
  word wVar7;
  Vec_Int_t *p_00;
  byte bVar8;
  int k;
  long lVar9;
  
  wVar5 = Acb_ObjTruth(p,iObj);
  iVar2 = Acb_ObjIsCio(p,iObj);
  if (iVar2 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0xe0,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
  }
  iVar2 = Acb_ObjFaninNum(p,iObj);
  if (iVar2 == 1) {
    if ((wVar5 != 0xaaaaaaaaaaaaaaaa) && (wVar5 != 0x5555555555555555)) {
      __assert_fail("uTruth == s_Truths6[0] || ~uTruth == s_Truths6[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                    ,0xe2,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
    }
    while( true ) {
      iVar2 = Acb_ObjFindNodeFanout(p,iObj);
      if (iVar2 < 0) break;
      piVar6 = Acb_ObjFanins(p,iObj);
      iVar4 = piVar6[1];
      iVar3 = Acb_ObjWhatFanin(p,iVar2,iObj);
      Acb_ObjPatchFanin(p,iVar2,iObj,iVar4);
      if ((wVar5 & 1) != 0) {
        wVar7 = Acb_ObjTruth(p,iVar2);
        bVar8 = (byte)(1 << ((byte)iVar3 & 0x1f));
        Vec_WrdWriteEntry(&p->vObjTruth,iVar2,
                          (s_Truths6[iVar3] & wVar7) >> (bVar8 & 0x3f) |
                          wVar7 << (bVar8 & 0x3f) & s_Truths6[iVar3]);
      }
      Acb_ObjRemoveDupFanins(p,iVar2);
    }
    if ((wVar5 & 1) == 0) {
      while( true ) {
        iVar2 = Acb_ObjFanoutNum(p,iObj);
        if (iVar2 < 1) break;
        piVar6 = Acb_ObjFanins(p,iObj);
        iVar2 = piVar6[1];
        iVar4 = Acb_ObjFanout(p,iObj,k);
        iVar3 = Acb_ObjIsCo(p,iVar4);
        if (iVar3 == 0) {
          __assert_fail("Acb_ObjIsCo(p, iFanout)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                        ,0xf3,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
        }
        Acb_ObjPatchFanin(p,iVar4,iObj,iVar2);
      }
    }
    iVar2 = Acb_ObjFanoutNum(p,iObj);
    if (iVar2 != 0) {
      return;
    }
    piVar6 = Acb_ObjFanins(p,iObj);
    lVar9 = 0;
    do {
      if (*piVar6 <= lVar9) {
        piVar6 = Acb_ObjFanins(p,iObj);
        iVar2 = *piVar6;
        lVar9 = 1;
        while( true ) {
          if (iVar2 < lVar9) {
            *piVar6 = 0;
            Acb_ObjCleanType(p,iObj);
            return;
          }
          if (piVar6[lVar9] < 1) break;
          piVar6[lVar9] = -1;
          lVar9 = lVar9 + 1;
        }
        __assert_fail("pFanins[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x1c8,"void Acb_ObjRemoveFanins(Acb_Ntk_t *, int)");
      }
      lVar1 = lVar9 + 1;
      lVar9 = lVar9 + 1;
      p_00 = Vec_WecEntry(&p->vFanouts,piVar6[lVar1]);
      iVar2 = Vec_IntRemove(p_00,iObj);
    } while (iVar2 != 0);
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0x223,"void Acb_ObjRemoveFaninFanout(Acb_Ntk_t *, int)");
  }
  __assert_fail("Acb_ObjFaninNum(p, iObj) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                ,0xe1,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_ObjRemoveBufInv( Acb_Ntk_t * p, int iObj )
{
    int iFanout;
    word uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFaninNum(p, iObj) == 1 );
    assert( uTruth == s_Truths6[0] || ~uTruth == s_Truths6[0] );
    while ( (iFanout = Acb_ObjFindNodeFanout(p, iObj)) >= 0 )
    {
        int iFanin = Acb_ObjFanin( p, iObj, 0 );
        int iObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
        Acb_ObjPatchFanin( p, iFanout, iObj, iFanin );
        if ( uTruth & 1 ) // inv
        {
            word uTruthF = Acb_ObjTruth( p, iFanout );
            Vec_WrdWriteEntry( &p->vObjTruth, iFanout, Abc_Tt6Flip(uTruthF, iObjIndex) );
        }
        Acb_ObjRemoveDupFanins( p, iFanout );
    }
    while ( (uTruth & 1) == 0 && Acb_ObjFanoutNum(p, iObj) > 0 )
    {
        int iFanin = Acb_ObjFanin( p, iObj, 0 );
        int iFanout = Acb_ObjFanout( p, iObj, 0 );
        assert( Acb_ObjIsCo(p, iFanout) );
        Acb_ObjPatchFanin( p, iFanout, iObj, iFanin );
    }
    if ( Acb_ObjFanoutNum(p, iObj) == 0 )
    {
        Acb_ObjRemoveFaninFanout( p, iObj );
        Acb_ObjRemoveFanins( p, iObj );
        Acb_ObjCleanType( p, iObj );
    }
}